

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.cpp
# Opt level: O2

void __thiscall YAJLMiscData::fetch_comment(YAJLMiscData *this,bitio_stream *bstream)

{
  ssize_t sVar1;
  char *pcVar2;
  size_t in_RCX;
  void *in_RDX;
  void *extraout_RDX;
  void *pvVar3;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  int i;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  bool bVar7;
  char *com_data;
  
  bVar7 = this->ignore;
  sVar1 = bitio::bitio_stream::read(bstream,0x10,in_RDX,in_RCX);
  if (bVar7 == false) {
    uVar6 = (ulong)((int)sVar1 - 2U & 0xffff);
    pcVar2 = (char *)operator_new__(uVar6);
    pvVar3 = extraout_RDX_01;
    com_data = pcVar2;
    for (uVar4 = 0; uVar6 != uVar4; uVar4 = uVar4 + 1) {
      sVar1 = bitio::bitio_stream::read(bstream,8,pvVar3,in_RCX);
      pcVar2[uVar4] = (char)sVar1;
      pvVar3 = extraout_RDX_02;
    }
    std::vector<char_*,_std::allocator<char_*>_>::push_back(&this->comments,&com_data);
  }
  else {
    uVar5 = (int)sVar1 + 0xfffeU & 0xffff;
    pvVar3 = extraout_RDX;
    while (bVar7 = uVar5 != 0, uVar5 = uVar5 - 1, bVar7) {
      bitio::bitio_stream::read(bstream,8,pvVar3,in_RCX);
      pvVar3 = extraout_RDX_00;
    }
  }
  return;
}

Assistant:

void YAJLMiscData::fetch_comment(bitio::bitio_stream *bstream) {
    if (!ignore) {
        // param-length followed by comment-bytes.
        u16 length = bstream->read(0x10);
        length -= 2;
        auto *com_data = new char[length];
        for (int i = 0; i < length; i++) {
            com_data[i] = bstream->read(0x8);
        }
        comments.push_back(com_data);
    } else {
        u16 length = bstream->read(0x10);
        length -= 2;
        for (int i = 0; i < length; i++) {
            bstream->read(0x8);
        }
    }
}